

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O2

image_u8x3_t * pjpeg_to_u8x3_baseline(pjpeg_t *pj)

{
  int iVar1;
  pjpeg_component_t *ppVar2;
  ulong uVar3;
  int y;
  image_u8x3_t *piVar4;
  int iVar5;
  int dx;
  uint uVar6;
  int x;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint8_t uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  if (pj->ncomponents != 3) {
    __assert_fail("pj->ncomponents == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pjpeg.c"
                  ,0x2e2,"image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *)");
  }
  ppVar2 = pj->components;
  uVar6 = ppVar2->height / ppVar2[1].height;
  uVar3 = (ulong)ppVar2->width / (ulong)ppVar2[1].width;
  uVar18 = ppVar2->height / ppVar2[2].height;
  uVar16 = ppVar2->width / ppVar2[2].width;
  uVar19 = '\0';
  piVar4 = image_u8x3_create(pj->width,pj->height);
  uVar7 = (uint)uVar3;
  if (uVar7 == 1 && (uVar6 == 1 && (uVar16 == 1 && uVar18 == 1))) {
    for (uVar6 = 0; uVar6 < pj->height; uVar6 = uVar6 + 1) {
      iVar5 = 0;
      for (uVar7 = 0; uVar7 < pj->width; uVar7 = uVar7 + 1) {
        iVar9 = (uint)ppVar2->data[ppVar2->stride * uVar6 + uVar7] * 0x10000;
        iVar15 = ppVar2[2].data[ppVar2[2].stride * uVar6 + uVar7] - 0x80;
        uVar18 = iVar15 * 0x166e9 + iVar9 >> 0x10;
        uVar16 = uVar18;
        if (0xfe < uVar18) {
          uVar16 = 0xff;
        }
        iVar14 = ppVar2[1].data[ppVar2[1].stride * uVar6 + uVar7] - 0x80;
        uVar13 = (uint8_t)uVar16;
        if ((int)uVar18 < 0) {
          uVar13 = uVar19;
        }
        piVar4->buf[(int)(piVar4->stride * uVar6 + iVar5)] = uVar13;
        uVar18 = iVar15 * -0xb6d2 + iVar14 * -0x581a + iVar9 >> 0x10;
        uVar16 = uVar18;
        if (0xfe < uVar18) {
          uVar16 = 0xff;
        }
        uVar13 = (uint8_t)uVar16;
        if ((int)uVar18 < 0) {
          uVar13 = uVar19;
        }
        piVar4->buf[(long)(int)(piVar4->stride * uVar6 + iVar5) + 1] = uVar13;
        uVar18 = iVar14 * 0x1c5a2 + iVar9 >> 0x10;
        uVar16 = uVar18;
        if (0xfe < uVar18) {
          uVar16 = 0xff;
        }
        uVar13 = (uint8_t)uVar16;
        if ((int)uVar18 < 0) {
          uVar13 = uVar19;
        }
        piVar4->buf[(long)(int)(piVar4->stride * uVar6 + iVar5) + 2] = uVar13;
        iVar5 = iVar5 + 3;
      }
    }
  }
  else {
    uVar8 = 0;
    if (uVar7 == uVar16 && uVar6 == uVar18) {
      for (uVar16 = 0; uVar16 < pj->height / uVar6; uVar16 = uVar16 + 1) {
        for (uVar18 = 0; uVar18 < (uint)(pj->width / uVar3); uVar18 = uVar18 + 1) {
          iVar15 = ppVar2[1].data[ppVar2[1].stride * uVar16 + uVar18] - 0x80;
          iVar5 = ppVar2[2].data[ppVar2[2].stride * uVar16 + uVar18] - 0x80;
          for (iVar9 = 0; iVar9 < (int)uVar6; iVar9 = iVar9 + 1) {
            iVar17 = iVar9 + uVar16 * uVar6;
            for (iVar14 = 0; iVar14 < (int)uVar7; iVar14 = iVar14 + 1) {
              iVar1 = iVar14 + uVar18 * uVar7;
              iVar10 = (uint)ppVar2->data[ppVar2->stride * iVar17 + iVar1] * 0x10000;
              uVar20 = iVar10 + iVar5 * 0x166e9 >> 0x10;
              uVar11 = uVar20;
              if (0xfe < uVar20) {
                uVar11 = 0xff;
              }
              uVar19 = (uint8_t)uVar11;
              if ((int)uVar20 < 0) {
                uVar19 = '\0';
              }
              iVar1 = iVar1 * 3;
              piVar4->buf[piVar4->stride * iVar17 + iVar1] = uVar19;
              uVar20 = iVar5 * -0xb6d2 + iVar15 * -0x581a + iVar10 >> 0x10;
              uVar11 = uVar20;
              if (0xfe < uVar20) {
                uVar11 = 0xff;
              }
              uVar19 = (uint8_t)uVar11;
              if ((int)uVar20 < 0) {
                uVar19 = '\0';
              }
              piVar4->buf[(long)(piVar4->stride * iVar17 + iVar1) + 1] = uVar19;
              uVar20 = iVar10 + iVar15 * 0x1c5a2 >> 0x10;
              uVar11 = uVar20;
              if (0xfe < uVar20) {
                uVar11 = 0xff;
              }
              if ((int)uVar20 < 0) {
                uVar11 = uVar8;
              }
              piVar4->buf[(long)(piVar4->stride * iVar17 + iVar1) + 2] = (uint8_t)uVar11;
            }
          }
        }
      }
    }
    else {
      for (; uVar8 < pj->height; uVar8 = uVar8 + 1) {
        iVar5 = 0;
        for (uVar11 = 0; uVar11 < pj->width; uVar11 = uVar11 + 1) {
          dVar21 = (double)ppVar2->data[ppVar2->stride * uVar8 + uVar11];
          dVar22 = (double)(int)(ppVar2[2].data
                                 [(int)uVar11 / (int)uVar16 +
                                  ((int)uVar8 / (int)uVar18) * ppVar2[2].stride] - 0x80);
          dVar23 = dVar22 * 1.402 + dVar21;
          if (0.0 <= dVar23) {
            uVar19 = 0xff;
            if (dVar23 <= 255.0) {
              uVar19 = (uint8_t)(int)dVar23;
            }
          }
          else {
            uVar19 = '\0';
          }
          dVar23 = (double)(int)(ppVar2[1].data
                                 [((int)uVar8 / (int)uVar6) * ppVar2[1].stride +
                                  (int)uVar11 / (int)uVar7] - 0x80);
          dVar22 = dVar22 * -0.71414 + dVar23 * -0.34414 + dVar21;
          if (0.0 <= dVar22) {
            uVar13 = 0xff;
            if (dVar22 <= 255.0) {
              uVar13 = (uint8_t)(int)dVar22;
            }
          }
          else {
            uVar13 = '\0';
          }
          dVar21 = dVar23 * 1.772 + dVar21;
          if (0.0 <= dVar21) {
            uVar12 = 0xff;
            if (dVar21 <= 255.0) {
              uVar12 = (uint8_t)(int)dVar21;
            }
          }
          else {
            uVar12 = '\0';
          }
          piVar4->buf[(int)(piVar4->stride * uVar8 + iVar5)] = uVar19;
          piVar4->buf[(long)(int)(piVar4->stride * uVar8 + iVar5) + 1] = uVar13;
          piVar4->buf[(long)(int)(piVar4->stride * uVar8 + iVar5) + 2] = uVar12;
          iVar5 = iVar5 + 3;
        }
      }
    }
  }
  return piVar4;
}

Assistant:

image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *pj)
{
    assert(pj->ncomponents == 3);

    pjpeg_component_t *Y = &pj->components[0];
    pjpeg_component_t *Cb = &pj->components[1];
    pjpeg_component_t *Cr = &pj->components[2];

    int Cb_factor_y = Y->height / Cb->height;
    int Cb_factor_x = Y->width / Cb->width;

    int Cr_factor_y = Y->height / Cr->height;
    int Cr_factor_x = Y->width / Cr->width;

    image_u8x3_t *im = image_u8x3_create(pj->width, pj->height);

    if (Cr_factor_y == 1 && Cr_factor_x == 1 && Cb_factor_y == 1 && Cb_factor_x == 1) {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x] * 65536;
                int32_t cb_val = Cb->data[y*Cb->stride + x] - 128;
                int32_t cr_val = Cr->data[y*Cr->stride + x] - 128;

                int32_t r_val = y_val +  91881 * cr_val;
                int32_t g_val = y_val + -22554 * cb_val - 46802 * cr_val;
                int32_t b_val = y_val + 116130 * cb_val;

                im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
            }
        }
    } else if (Cb_factor_y == Cr_factor_y && Cb_factor_x == Cr_factor_x) {
        for (int by = 0; by < pj->height / Cb_factor_y; by++) {
            for (int bx = 0; bx < pj->width / Cb_factor_x; bx++) {

                int32_t cb_val = Cb->data[by*Cb->stride + bx] - 128;
                int32_t cr_val = Cr->data[by*Cr->stride + bx] - 128;

                int32_t r0 =  91881 * cr_val;
                int32_t g0 = -22554 * cb_val - 46802 * cr_val;
                int32_t b0 = 116130 * cb_val;

                for (int dy = 0; dy < Cb_factor_y; dy++) {
                    int y = by*Cb_factor_y + dy;

                    for (int dx = 0; dx < Cb_factor_x; dx++) {
                        int x = bx*Cb_factor_x + dx;

                        int32_t y_val = Y->data[y*Y->stride + x] * 65536;

                        int32_t r_val = r0 + y_val;
                        int32_t g_val = g0 + y_val;
                        int32_t b_val = b0 + y_val;

                        im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                        im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                        im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
                    }
                }
            }
        }
    } else {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x];
                int32_t cb_val = Cb->data[(y / Cb_factor_y)*Cb->stride + (x / Cb_factor_x)] - 128;
                int32_t cr_val = Cr->data[(y / Cr_factor_y)*Cr->stride + (x / Cr_factor_x)] - 128;

                uint8_t r_val = clampd(y_val + 1.402 * cr_val);
                uint8_t g_val = clampd(y_val - 0.34414 * cb_val - 0.71414 * cr_val);
                uint8_t b_val = clampd(y_val + 1.772 * cb_val);

                im->buf[y*im->stride + 3*x + 0 ] = r_val;
                im->buf[y*im->stride + 3*x + 1 ] = g_val;
                im->buf[y*im->stride + 3*x + 2 ] = b_val;
            }
        }
    }

    return im;
}